

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_stack_check(ASMState *as,BCReg topslot,IRIns *irp,RegSet allow,ExitNo exitno)

{
  uint uVar1;
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  ASMState *in_RDI;
  uint in_R8D;
  Reg r;
  Reg pbase;
  uint local_40;
  uint local_3c;
  
  if (in_RDX == 0) {
    local_3c = 2;
  }
  else {
    local_3c = (uint)*(byte *)(in_RDX + 6);
  }
  if (in_ECX == 0) {
    local_40 = 0;
  }
  else {
    local_40 = 0;
    for (uVar1 = in_ECX; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x80000000) {
      local_40 = local_40 + 1;
    }
  }
  emit_jcc(in_RDI,2,in_RDI->J->exitstubgroup[in_R8D >> 5] + ((in_R8D & 0x1f) << 2));
  if (in_ECX == 0) {
    emit_rmro(in_RDI,XO_MOV,local_40 | 0x80200,4,0);
  }
  else {
    in_RDI->modset = 1 << ((byte)local_40 & 0x1f) | in_RDI->modset;
  }
  emit_gri(in_RDI,0x838107,local_40,in_ESI << 3);
  if (((local_3c & 0x80) == 0) && (local_3c != local_40)) {
    emit_rr(in_RDI,0x2b0000fe,local_40,local_3c);
  }
  else {
    emit_rmro(in_RDI,0x2b0000fe,local_40,0x80,(int)in_RDI->J + -0xb8);
  }
  emit_rmro(in_RDI,XO_MOV,local_40,local_40,0x20);
  emit_rma(in_RDI,XO_MOV,local_40,in_RDI->J[-1].bpropcache + 0xb);
  if (in_ECX == 0) {
    emit_rmro(in_RDI,XO_MOVto,local_40 | 0x80200,4,0);
  }
  return;
}

Assistant:

static void asm_stack_check(ASMState *as, BCReg topslot,
			    IRIns *irp, RegSet allow, ExitNo exitno)
{
  /* Try to get an unused temp. register, otherwise spill/restore eax. */
  Reg pbase = irp ? irp->r : RID_BASE;
  Reg r = allow ? rset_pickbot(allow) : RID_EAX;
  emit_jcc(as, CC_B, exitstub_addr(as->J, exitno));
  if (allow == RSET_EMPTY)  /* Restore temp. register. */
    emit_rmro(as, XO_MOV, r|REX_64, RID_ESP, 0);
  else
    ra_modified(as, r);
  emit_gri(as, XG_ARITHi(XOg_CMP), r|REX_GC64, (int32_t)(8*topslot));
  if (ra_hasreg(pbase) && pbase != r)
    emit_rr(as, XO_ARITH(XOg_SUB), r|REX_GC64, pbase);
  else
#if LJ_GC64
    emit_rmro(as, XO_ARITH(XOg_SUB), r|REX_64, RID_DISPATCH,
	      (int32_t)dispofs(as, &J2G(as->J)->jit_base));
#else
    emit_rmro(as, XO_ARITH(XOg_SUB), r, RID_NONE,
	      ptr2addr(&J2G(as->J)->jit_base));
#endif
  emit_rmro(as, XO_MOV, r|REX_GC64, r, offsetof(lua_State, maxstack));
  emit_getgl(as, r, cur_L);
  if (allow == RSET_EMPTY)  /* Spill temp. register. */
    emit_rmro(as, XO_MOVto, r|REX_64, RID_ESP, 0);
}